

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O2

int lyb_parse_schema_hash
              (lys_node *sparent,lys_module *mod,char *data,char *yang_data_name,int options,
              lys_node **snode,lyb_state *lybs)

{
  long lVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  lys_node *plVar7;
  LY_VLOG_ELEM elem_type;
  byte bVar8;
  lys_module *module;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  byte local_47 [7];
  lys_module *plStack_40;
  uint8_t hash [7];
  char cVar9;
  ulong uVar10;
  
  if ((sparent == (lys_node *)0x0) != (mod != (lys_module *)0x0)) {
    __assert_fail("(sparent || mod) && (!sparent || !mod)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                  ,0x38a,
                  "int lyb_parse_schema_hash(const struct lys_node *, const struct lys_module *, const char *, const char *, int, struct lys_node **, struct lyb_state *)"
                 );
  }
  uVar4 = lyb_read(data,local_47,1,lybs);
  uVar15 = (ulong)uVar4;
  if ((int)uVar4 < 0) {
    return -1;
  }
  pcVar13 = data + uVar15;
  for (uVar18 = 0; -1 < (char)(local_47[0] << ((byte)uVar18 & 0x1f)); uVar18 = uVar18 + 1) {
    if ((int)uVar18 == 9) {
      return -1;
    }
  }
  plStack_40 = mod;
  local_47[uVar18] = local_47[0];
  lVar1 = uVar18 + 1;
  uVar10 = uVar18 & 0xffffffff;
  while( true ) {
    module = plStack_40;
    cVar9 = (char)uVar10;
    bVar8 = cVar9 - 1;
    uVar10 = (ulong)bVar8;
    iVar14 = (int)uVar15;
    if (cVar9 == '\0') break;
    cVar9 = (char)uVar18;
    uVar16 = ((uint)uVar18 & 0xff) - 1;
    uVar4 = lyb_read(pcVar13,local_47 + uVar16,1,lybs);
    if ((int)uVar4 < 0) {
      return -1;
    }
    bVar3 = local_47[uVar16];
    if (-1 < (char)(bVar3 << ((byte)uVar16 & 0x1f))) {
      __assert_fail("hash[j - 1] & (LYB_HASH_COLLISION_ID >> (j - 1))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                    ,0x3a0,
                    "int lyb_parse_schema_hash(const struct lys_node *, const struct lys_module *, const char *, const char *, int, struct lys_node **, struct lyb_state *)"
                   );
    }
    uVar15 = (ulong)(iVar14 + uVar4);
    pcVar13 = pcVar13 + uVar4;
    uVar18 = (ulong)bVar8;
    if ((bVar3 >> (9U - cVar9 & 0x1f) & 0x7f) != 0) {
      __assert_fail("!(hash[j - 1] & (LYB_HASH_MASK << (LYB_HASH_BITS - (j - 1))))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                    ,0x3a2,
                    "int lyb_parse_schema_hash(const struct lys_node *, const struct lys_module *, const char *, const char *, int, struct lys_node **, struct lyb_state *)"
                   );
    }
  }
  if (((plStack_40 == (lys_module *)0x0) || (yang_data_name == (char *)0x0)) ||
     ((options & 0x1000000U) == 0)) {
    if (sparent != (lys_node *)0x0) goto LAB_001414b2;
    plVar7 = (lys_node *)0x0;
  }
  else {
    sVar6 = strlen(yang_data_name);
    sparent = lyp_get_yang_data_template(module,yang_data_name,(int)sVar6);
    if (sparent == (lys_node *)0x0) {
      sparent = (lys_node *)0x0;
      goto LAB_0014151b;
    }
LAB_001414b2:
    plVar7 = sparent;
    if ((sparent->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) {
      plVar7 = (lys_node *)0x0;
      do {
        plVar7 = lys_getnext(plVar7,sparent,(lys_module *)0x0,8);
        module = plStack_40;
        if (plVar7 == (lys_node *)0x0) goto LAB_0014151b;
      } while ((((byte)options >> 4 & plVar7->nodetype == LYS_INPUT) == 0) &&
              ((options & 0x20U) == 0 || plVar7->nodetype != LYS_OUTPUT));
    }
  }
  sparent = plVar7;
  plVar7 = (lys_node *)0x0;
  module = plStack_40;
  while (plVar7 = lys_getnext(plVar7,sparent,module,0), plVar7 != (lys_node *)0x0) {
    iVar5 = lyb_has_schema_model(plVar7,lybs->models,lybs->mod_count);
    if (iVar5 != 0) {
      lVar11 = lVar1;
      lVar17 = 0;
      do {
        bVar19 = lVar11 == 0;
        lVar11 = lVar11 + -1;
        module = plStack_40;
        if (bVar19) goto LAB_00141598;
        bVar8 = lyb_hash(plVar7,(uint8_t)lVar17);
        pbVar2 = local_47 + lVar17;
        module = plStack_40;
        lVar17 = lVar17 + 1;
      } while (bVar8 == *pbVar2);
    }
  }
LAB_0014151b:
  plVar7 = (lys_node *)0x0;
LAB_00141598:
  *snode = plVar7;
  if ((((uint)options >> 9 & 1) != 0) && (plVar7 == (lys_node *)0x0)) {
    if (module == (lys_module *)0x0) {
      pcVar13 = sparent->name;
      pcVar12 = "Failed to find matching hash for a child of \"%s\".";
      elem_type = LY_VLOG_LYS;
    }
    else {
      pcVar13 = module->name;
      pcVar12 = "Failed to find matching hash for a top-level node from \"%s\".";
      elem_type = LY_VLOG_NONE;
      sparent = (lys_node *)0x0;
    }
    iVar14 = -1;
    ly_vlog(lybs->ctx,LYE_SPEC,elem_type,sparent,pcVar12,pcVar13);
  }
  return iVar14;
}

Assistant:

static int
lyb_parse_schema_hash(const struct lys_node *sparent, const struct lys_module *mod, const char *data, const char *yang_data_name,
                      int options, struct lys_node **snode, struct lyb_state *lybs)
{
    int r, ret = 0;
    uint8_t i, j;
    struct lys_node *sibling;
    LYB_HASH hash[LYB_HASH_BITS - 1];

    assert((sparent || mod) && (!sparent || !mod));

    /* read the first hash */
    ret += (r = lyb_read(data, &hash[0], sizeof *hash, lybs));
    LYB_HAVE_READ_RETURN(r, data, -1);

    /* based on the first hash read all the other ones, if any */
    for (i = 0; !(hash[0] & (LYB_HASH_COLLISION_ID >> i)); ++i) {
        if (i > LYB_HASH_BITS) {
            return -1;
        }
    }

    /* move the first hash on its accurate position */
    hash[i] = hash[0];

    /* read the rest of hashes */
    for (j = i; j; --j) {
        ret += (r = lyb_read(data, &hash[j - 1], sizeof *hash, lybs));
        LYB_HAVE_READ_RETURN(r, data, -1);

        /* correct collision ID */
        assert(hash[j - 1] & (LYB_HASH_COLLISION_ID >> (j - 1)));
        /* preceded with zeros */
        assert(!(hash[j - 1] & (LYB_HASH_MASK << (LYB_HASH_BITS - (j - 1)))));
    }

    /* handle yang data templates */
    if ((options & LYD_OPT_DATA_TEMPLATE) && yang_data_name && mod) {
        sparent = lyp_get_yang_data_template(mod, yang_data_name, strlen(yang_data_name));
        if (!sparent) {
            sibling = NULL;
            goto finish;
        }
    }

    /* handle RPC/action input/output */
    if (sparent && (sparent->nodetype & (LYS_RPC | LYS_ACTION))) {
        sibling = NULL;
        while ((sibling = (struct lys_node *)lys_getnext(sibling, sparent, NULL, LYS_GETNEXT_WITHINOUT))) {
            if ((sibling->nodetype == LYS_INPUT) && (options & LYD_OPT_RPC)) {
                break;
            }
            if ((sibling->nodetype == LYS_OUTPUT) && (options & LYD_OPT_RPCREPLY)) {
                break;
            }
        }
        if (!sibling) {
            /* fail */
            goto finish;
        }

        /* use only input/output children nodes */
        sparent = sibling;
    }

    /* find our node with matching hashes */
    sibling = NULL;
    while ((sibling = (struct lys_node *)lys_getnext(sibling, sparent, mod, 0))) {
        /* skip schema nodes from models not present during printing */
        if (lyb_has_schema_model(sibling, lybs->models, lybs->mod_count) && lyb_is_schema_hash_match(sibling, hash, i + 1)) {
            /* match found */
            break;
        }
    }

finish:
    *snode = sibling;
    if (!sibling && (options & LYD_OPT_STRICT)) {
        if (mod) {
            LOGVAL(lybs->ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Failed to find matching hash for a top-level node from \"%s\".",
                    mod->name);
        } else {
            LOGVAL(lybs->ctx, LYE_SPEC, LY_VLOG_LYS, sparent, "Failed to find matching hash for a child of \"%s\".",
                    sparent->name);
        }
        return -1;
    }

    return ret;
}